

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_7zip.c
# Opt level: O0

int read_Times(archive_read *a,_7z_header_info *h,int type)

{
  long lVar1;
  int iVar2;
  uchar *data;
  byte *pbVar3;
  uchar *puVar4;
  uint64_t uVar5;
  int in_EDX;
  ulong *in_RSI;
  long in_RDI;
  uint i;
  int allAreDefined;
  uchar *timeBools;
  _7zip_entry *entries;
  uchar *p;
  _7zip_conflict *zip;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar6;
  archive_read *a_00;
  
  lVar1 = **(long **)(in_RDI + 0x948);
  a_00 = *(archive_read **)(lVar1 + 0xa0);
  data = (uchar *)calloc(*(size_t *)(lVar1 + 0x98),1);
  if (data == (uchar *)0x0) {
    return -1;
  }
  pbVar3 = header_bytes(a_00,(size_t)data);
  if (pbVar3 != (byte *)0x0) {
    uVar6 = (uint)*pbVar3;
    if (uVar6 == 0) {
      iVar2 = read_Bools(a_00,data,(ulong)CONCAT14(*pbVar3,in_stack_ffffffffffffffb8));
      if (iVar2 < 0) goto LAB_001affa8;
    }
    else {
      memset(data,1,*(size_t *)(lVar1 + 0x98));
    }
    puVar4 = header_bytes(a_00,(size_t)data);
    if ((puVar4 != (uchar *)0x0) &&
       ((*puVar4 == '\0' ||
        ((iVar2 = parse_7zip_uint64((archive_read *)CONCAT44(uVar6,in_stack_ffffffffffffffb8),
                                    (uint64_t *)
                                    CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0)),
         -1 < iVar2 && (*in_RSI < 0xf4241)))))) {
      uVar6 = 0;
      do {
        if (*(ulong *)(lVar1 + 0x98) <= (ulong)uVar6) {
          free(data);
          return 0;
        }
        if (data[uVar6] != '\0') {
          puVar4 = header_bytes(a_00,(size_t)data);
          if (puVar4 == (uchar *)0x0) break;
          if (in_EDX == 0x12) {
            uVar5 = archive_le64dec((void *)CONCAT44(0x12,in_stack_ffffffffffffffb0));
            fileTimeToUtc(uVar5,(time_t *)(&(a_00->archive).file_count + (ulong)uVar6 * 0x16),
                          (long *)((long)&(a_00->archive).error_string + (ulong)uVar6 * 0x58 + 8));
            *(uint *)(&(a_00->archive).archive_format_name + (ulong)uVar6 * 0xb) =
                 *(uint *)(&(a_00->archive).archive_format_name + (ulong)uVar6 * 0xb) | 4;
          }
          else if (in_EDX == 0x13) {
            uVar5 = archive_le64dec((void *)CONCAT44(0x13,in_stack_ffffffffffffffb0));
            fileTimeToUtc(uVar5,(time_t *)(&(a_00->archive).compression_name + (ulong)uVar6 * 0xb),
                          (long *)((long)&(a_00->archive).error_string + (ulong)uVar6 * 0x58));
            *(uint *)(&(a_00->archive).archive_format_name + (ulong)uVar6 * 0xb) =
                 *(uint *)(&(a_00->archive).archive_format_name + (ulong)uVar6 * 0xb) | 2;
          }
          else if (in_EDX == 0x14) {
            uVar5 = archive_le64dec((void *)CONCAT44(0x14,in_stack_ffffffffffffffb0));
            fileTimeToUtc(uVar5,(time_t *)(&(a_00->archive).compression_code + (ulong)uVar6 * 0x16),
                          (long *)(&(a_00->archive).error + (ulong)uVar6 * 0xb));
            *(uint *)(&(a_00->archive).archive_format_name + (ulong)uVar6 * 0xb) =
                 *(uint *)(&(a_00->archive).archive_format_name + (ulong)uVar6 * 0xb) | 1;
          }
        }
        uVar6 = uVar6 + 1;
      } while( true );
    }
  }
LAB_001affa8:
  free(data);
  return -1;
}

Assistant:

static int
read_Times(struct archive_read *a, struct _7z_header_info *h, int type)
{
	struct _7zip *zip = (struct _7zip *)a->format->data;
	const unsigned char *p;
	struct _7zip_entry *entries = zip->entries;
	unsigned char *timeBools;
	int allAreDefined;
	unsigned i;

	timeBools = calloc((size_t)zip->numFiles, sizeof(*timeBools));
	if (timeBools == NULL)
		return (-1);

	/* Read allAreDefined. */
	if ((p = header_bytes(a, 1)) == NULL)
		goto failed;
	allAreDefined = *p;
	if (allAreDefined)
		memset(timeBools, 1, (size_t)zip->numFiles);
	else {
		if (read_Bools(a, timeBools, (size_t)zip->numFiles) < 0)
			goto failed;
	}

	/* Read external. */
	if ((p = header_bytes(a, 1)) == NULL)
		goto failed;
	if (*p) {
		if (parse_7zip_uint64(a, &(h->dataIndex)) < 0)
			goto failed;
		if (1000000 < h->dataIndex)
			goto failed;
	}

	for (i = 0; i < zip->numFiles; i++) {
		if (!timeBools[i])
			continue;
		if ((p = header_bytes(a, 8)) == NULL)
			goto failed;
		switch (type) {
		case kCTime:
			fileTimeToUtc(archive_le64dec(p),
			    &(entries[i].ctime),
			    &(entries[i].ctime_ns));
			entries[i].flg |= CTIME_IS_SET;
			break;
		case kATime:
			fileTimeToUtc(archive_le64dec(p),
			    &(entries[i].atime),
			    &(entries[i].atime_ns));
			entries[i].flg |= ATIME_IS_SET;
			break;
		case kMTime:
			fileTimeToUtc(archive_le64dec(p),
			    &(entries[i].mtime),
			    &(entries[i].mtime_ns));
			entries[i].flg |= MTIME_IS_SET;
			break;
		}
	}

	free(timeBools);
	return (0);
failed:
	free(timeBools);
	return (-1);
}